

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O0

void __thiscall PingServer::incomingData(PingServer *this,Stream *stream)

{
  ostream *poVar1;
  long *local_68;
  char local_55 [8];
  char c;
  string local_48 [32];
  IPV4Address local_28 [4];
  ushort local_24;
  IPV4Address source;
  PacketStream *packetStream;
  Stream *stream_local;
  PingServer *this_local;
  
  std::operator<<((ostream *)&std::cerr,"new data....");
  if (stream == (Stream *)0x0) {
    local_68 = (long *)0x0;
  }
  else {
    local_68 = (long *)__dynamic_cast(stream,&Dashel::Stream::typeinfo,
                                      &Dashel::PacketStream::typeinfo,0xffffffffffffffff);
  }
  _source = local_68;
  if (local_68 != (long *)0x0) {
    Dashel::IPV4Address::IPV4Address(local_28,0,0);
    (**(code **)(*_source + 8))(_source,local_28);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Ping from ");
    Dashel::IPV4Address::hostname_abi_cxx11_();
    poVar1 = std::operator<<(poVar1,local_48);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
    std::operator<<(poVar1,": ");
    std::__cxx11::string::~string(local_48);
    while( true ) {
      (**(code **)(*(long *)((long)_source + *(long *)(*_source + -0x18)) + 0x20))
                ((long)_source + *(long *)(*_source + -0x18),local_55,1);
      if (local_55[0] == '\0') break;
      std::operator<<((ostream *)&std::cerr,local_55[0]);
    }
    std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("packetStream",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/udp.cpp"
                ,0x1d,"virtual void PingServer::incomingData(Stream *)");
}

Assistant:

void incomingData(Stream* stream)
	{
		cerr << "new data....";
		PacketStream* packetStream = dynamic_cast<PacketStream*>(stream);
		assert(packetStream);
		IPV4Address source;

		packetStream->receive(source);
		cerr << "Ping from " << source.hostname() << ":" << source.port << ": ";

		char c;
		while (true)
		{
			packetStream->read(&c, 1);
			if (c)
				cerr << c;
			else
				break;
		}
		cerr << endl;
	}